

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O3

void __thiscall xmrig::CudaBackend::~CudaBackend(CudaBackend *this)

{
  pointer pCVar1;
  int __fd;
  CudaBackendPrivate *pCVar2;
  
  (this->super_IBackend)._vptr_IBackend = (_func_int **)&PTR__CudaBackend_001ad3a0;
  pCVar2 = this->d_ptr;
  if (pCVar2 != (CudaBackendPrivate *)0x0) {
    Workers<xmrig::CudaLaunchData>::~Workers(&pCVar2->workers);
    pCVar1 = (pCVar2->threads).
             super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pCVar1 != (pointer)0x0) {
      operator_delete(pCVar1);
    }
    std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector(&pCVar2->devices);
  }
  operator_delete(pCVar2);
  __fd = (int)pCVar2;
  CudaLib::close(__fd);
  NvmlLib::close(__fd);
  return;
}

Assistant:

xmrig::CudaBackend::~CudaBackend()
{
    delete d_ptr;

    CudaLib::close();

#   ifdef XMRIG_FEATURE_NVML
    NvmlLib::close();
#   endif
}